

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::
build(BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BVHN<4> *this_00;
  Scene *pSVar3;
  PrimRef *pPVar4;
  MemoryMonitorInterface *pMVar5;
  undefined8 uVar6;
  Allocator alloc;
  mvector<PrimRef> *primrefarray_i;
  long *plVar7;
  PrimRef *pPVar8;
  ulong uVar9;
  NodeRefPtr<4> root;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  ulong numPrimRefs;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  anon_class_8_1_8991fb9c reportFinishedRange;
  anon_class_8_1_8991fb9c createLeaf;
  PrimInfo pinfo;
  Set local_1c4;
  Create local_1c3;
  Set local_1c2;
  Create local_1c1;
  mvector<PrimRef> *local_1c0;
  size_t *local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  CreateAlloc local_190;
  anon_class_8_1_8991fb9c local_188;
  anon_class_8_1_8991fb9c local_180;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  long lStack_130;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e8;
  long lStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_b8;
  size_t sStack_b0;
  PrimRef *local_a8;
  CreateAlloc *pCStack_a0;
  Create *local_98;
  Set *local_90;
  Create *local_88;
  Set *local_80;
  anon_class_8_1_8991fb9c *local_78;
  BuildProgressMonitorInterface *local_70;
  anon_class_8_1_8991fb9c *local_68;
  PrimRef *local_60;
  Scene *local_58;
  PrimRef *local_50;
  Scene *local_48;
  PrimRef *local_40;
  
  if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x20);
  }
  this_00 = this->bvh;
  pSVar3 = this->scene;
  numPrimRefs = (pSVar3->world).numBezierCurves + (pSVar3->world).numLineSegments +
                (pSVar3->world).numPoints;
  if (numPrimRefs == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar13 = (this->prims).size_alloced;
    pPVar4 = (this->prims).items;
    if (pPVar4 != (PrimRef *)0x0) {
      if (sVar13 << 5 < 0x1c00000) {
        alignedFree(pPVar4);
      }
      else {
        os_free(pPVar4,sVar13 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar5 = (this->prims).alloc.device;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar13 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
    return;
  }
  local_128._0_8_ = &local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x01');
  *(undefined1 *)local_128._0_8_ = 0x34;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x1f8cf1e);
  paVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar7 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar7 == paVar10) {
    local_168._0_8_ = *(undefined8 *)paVar10;
    local_168._8_8_ = plVar7[3];
    local_178._0_8_ = &local_168;
  }
  else {
    local_168._0_8_ = *(undefined8 *)paVar10;
    local_178._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar7;
  }
  local_178._8_8_ = plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar11) {
    local_c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_c8._8_8_ = plVar7[3];
    local_d8._0_8_ = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_d8._8_8_ = plVar7[1];
  *plVar7 = (long)paVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1b0 = BVHN<4>::preBuild(this_00,(string *)&local_d8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_178._0_8_ != &local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_);
  }
  uVar9 = (this->prims).size_alloced;
  uVar15 = uVar9;
  if ((uVar9 < numPrimRefs) && (uVar15 = numPrimRefs, uVar14 = uVar9, uVar9 != 0)) {
    do {
      uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
      uVar14 = uVar15;
    } while (uVar15 < numPrimRefs);
  }
  local_1b8 = &(this->prims).size_active;
  if (numPrimRefs < (this->prims).size_active) {
    *local_1b8 = numPrimRefs;
  }
  local_1c0 = &this->prims;
  if (uVar9 == uVar15) {
    *local_1b8 = numPrimRefs;
    goto LAB_00bb123d;
  }
  pMVar5 = (this->prims).alloc.device;
  pPVar4 = (this->prims).items;
  uVar9 = uVar15 << 5;
  (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar9,0);
  if (uVar9 < 0x1c00000) {
    pPVar8 = (PrimRef *)alignedMalloc(uVar9,0x20);
  }
  else {
    pPVar8 = (PrimRef *)os_malloc(uVar9,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar8;
  if ((this->prims).size_active == 0) {
    sVar13 = (this->prims).size_alloced;
    if (pPVar4 != (PrimRef *)0x0) goto LAB_00bb11ee;
  }
  else {
    lVar12 = 0x10;
    uVar9 = 0;
    do {
      pPVar8 = (this->prims).items;
      puVar1 = (undefined8 *)((long)pPVar4 + lVar12 + -0x10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar8 + lVar12 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)&(pPVar4->lower).field_0 + lVar12);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar9 < (this->prims).size_active);
    sVar13 = (this->prims).size_alloced;
LAB_00bb11ee:
    if (sVar13 << 5 < 0x1c00000) {
      alignedFree(pPVar4);
    }
    else {
      os_free(pPVar4,sVar13 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar13 != 0) {
    pMVar5 = (local_1c0->alloc).device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar13 * -0x20,1);
  }
  (this->prims).size_active = numPrimRefs;
  (this->prims).size_alloced = uVar15;
LAB_00bb123d:
  primrefarray_i = local_1c0;
  sse2::createPrimRefArray
            ((PrimInfo *)&local_128.field_1,this->scene,MTY_CURVES,false,numPrimRefs,local_1c0,
             &(this->scene->progressInterface).super_BuildProgressMonitor);
  uVar9 = lStack_e0 - local_e8;
  uVar15 = (ulong)((uint)uVar9 & 3);
  lVar12 = uVar15 * 0x59 + 0x16;
  if (uVar15 == 0) {
    lVar12 = 0;
  }
  FastAllocator::init_estimate
            (&this->bvh->alloc,(uVar9 >> 2) * 0x17a + (uVar9 * 0xe0 >> 4) + lVar12);
  (this->settings).branchingFactor = 4;
  (this->settings).maxDepth = 0x28;
  for (sVar13 = 0; (4UL >> sVar13 & 1) == 0; sVar13 = sVar13 + 1) {
  }
  (this->settings).logBlockSize = sVar13;
  (this->settings).minLeafSize = 4;
  uVar9 = 0xffffffffffffffff;
  if (999999 < numPrimRefs) {
    uVar9 = numPrimRefs / 1000;
  }
  (this->settings).maxLeafSize = 4;
  (this->settings).finished_range_threshold = uVar9;
  local_78 = &local_180;
  local_68 = &local_188;
  local_190.super_Create.allocator = (Create)&this->bvh->alloc;
  pCStack_a0 = &local_190;
  local_58 = this->scene;
  local_a8 = (this->prims).items;
  local_70 = &local_58->progressInterface;
  local_d8._0_8_ = (this->settings).branchingFactor;
  local_d8._8_8_ = (this->settings).maxDepth;
  local_c8._M_allocated_capacity = (this->settings).logBlockSize;
  local_c8._8_8_ = (this->settings).minLeafSize;
  local_b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this->settings).maxLeafSize;
  sStack_b0 = (this->settings).finished_range_threshold;
  local_98 = &local_1c1;
  local_90 = &local_1c2;
  local_88 = &local_1c3;
  local_80 = &local_1c4;
  local_178._0_8_ = local_128._0_8_;
  local_178._8_8_ = local_128._8_8_;
  local_168._0_8_ = local_118._0_8_;
  local_168._8_8_ = local_118._8_8_;
  local_158 = local_108;
  uStack_150 = uStack_100;
  local_148 = local_f8;
  uStack_140 = uStack_f0;
  local_138 = local_e8;
  lStack_130 = lStack_e0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  alloc.talloc1 = (ThreadLocal *)0x0;
  alloc.alloc = (FastAllocator *)0x0;
  alloc.talloc0 = (ThreadLocal *)0x0;
  local_188.this = this;
  local_180.this = this;
  local_60 = local_a8;
  local_50 = local_a8;
  local_48 = local_58;
  local_40 = local_a8;
  root = BVHBuilderHair::
         BuilderT<embree::NodeRefPtr<4>,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:82:36)>
         ::recurse((BuilderT<embree::NodeRefPtr<4>,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:82:36)>
                    *)&local_d8.field_1,1,(PrimInfoRange *)&local_178.field_1,alloc,true,false);
  local_d8._0_8_ = local_128._0_8_;
  local_d8._8_8_ = local_128._8_8_;
  local_c8._M_allocated_capacity = local_118._0_8_;
  local_c8._8_8_ = local_118._8_8_;
  local_b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_;
  sStack_b0 = local_128._8_8_;
  local_a8 = (PrimRef *)local_118._0_8_;
  pCStack_a0 = (CreateAlloc *)local_118._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_d8.field_1,lStack_e0 - local_e8);
  if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
    root.ptr = (size_t)primrefarray_i;
    FastAllocator::share(&this->bvh->alloc,primrefarray_i);
  }
  if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
    sVar13 = (this->prims).size_alloced;
    pPVar4 = (this->prims).items;
    if (pPVar4 != (PrimRef *)0x0) {
      root.ptr = sVar13 << 5;
      if (root.ptr < (mvector<PrimRef> *)0x1c00000) {
        alignedFree(pPVar4);
      }
      else {
        os_free(pPVar4,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar5 = (primrefarray_i->alloc).device;
      root.ptr = sVar13 * -0x20;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,root.ptr,1);
    }
    *local_1b8 = 0;
    local_1b8[1] = 0;
    local_1b8[2] = 0;
  }
  BVHN<4>::cleanup(this->bvh,(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(this->bvh,local_1b0);
  return;
}

Assistant:

void build() 
      {
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.unshare(prims);

        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,false);
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairBuilderSAH");

        /* create primref array */
        prims.resize(numPrimitives);
        const PrimInfo pinfo = createPrimRefArray(scene,Geometry::MTY_CURVES,false,numPrimitives,prims,scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.size()*sizeof(typename BVH::OBBNode)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.size());
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        
        /* builder settings */
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();
        settings.finished_range_threshold = numPrimitives/1000;
        if (settings.finished_range_threshold < 1000)
          settings.finished_range_threshold = inf;

        /* creates a leaf node */
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& set, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
          
          if (set.size() == 0)
            return BVH::emptyNode;

          const unsigned int geomID0 = prims[set.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeaf(bvh,prims,set,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeaf(bvh,prims,set,alloc);
          else
            return CurvePrimitive::createLeaf(bvh,prims,set,alloc);
        };
        
        auto reportFinishedRange = [&] (const range<size_t>& range) -> void
          {
            PrimRef* begin = prims.data()+range.begin();
            PrimRef* end   = prims.data()+range.end(); // FIXME: extended end for spatial split builder!!!!!
            size_t bytes = (size_t)end - (size_t)begin;
            bvh->alloc.addBlock(begin,bytes);
          };
          
        /* build hierarchy */
        typename BVH::NodeRef root = BVHBuilderHair::build<NodeRef>
          (typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNode::Create(),
           typename BVH::AABBNode::Set(),
           typename BVH::OBBNode::Create(),
           typename BVH::OBBNode::Set(),
           createLeaf,scene->progressInterface,
           reportFinishedRange,
           scene,prims.data(),pinfo,settings);
        
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        
        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.share(prims);
        
        /* clear temporary data for static geometry */
        if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }